

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

char * rsa2_invalid(ssh_key *key,uint flags)

{
  char *pcVar1;
  ssh_hashalg *halg_00;
  char *pcVar2;
  ssh_hashalg *halg;
  char *sign_alg_name;
  size_t nbytes;
  size_t bits;
  RSAKey *rsa;
  ssh_key *psStack_18;
  uint flags_local;
  ssh_key *key_local;
  
  bits = (size_t)(key + -8);
  rsa._4_4_ = flags;
  psStack_18 = key;
  nbytes = mp_get_nbits((mp_int *)key[-7].vt);
  sign_alg_name = (char *)(nbytes + 7 >> 3);
  halg_00 = rsa2_hash_alg_for_flags(rsa._4_4_,(char **)&halg);
  pcVar1 = sign_alg_name;
  pcVar2 = (char *)rsa_pkcs1_length_of_fixed_parts(halg_00);
  if (pcVar1 < pcVar2) {
    key_local = (ssh_key *)
                dupprintf("%zu-bit RSA key is too short to generate %s signatures",nbytes,halg);
  }
  else {
    key_local = (ssh_key *)0x0;
  }
  return (char *)key_local;
}

Assistant:

static char *rsa2_invalid(ssh_key *key, unsigned flags)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);
    size_t bits = mp_get_nbits(rsa->modulus), nbytes = (bits + 7) / 8;
    const char *sign_alg_name;
    const ssh_hashalg *halg = rsa2_hash_alg_for_flags(flags, &sign_alg_name);
    if (nbytes < rsa_pkcs1_length_of_fixed_parts(halg)) {
        return dupprintf(
            "%"SIZEu"-bit RSA key is too short to generate %s signatures",
            bits, sign_alg_name);
    }

    return NULL;
}